

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_swift_struct_hashable_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  t_field *ptVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined3 in_register_00000009;
  char *pcVar5;
  pointer pptVar6;
  char *__s;
  string visibility;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  pcVar5 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar5 = "private";
  }
  __s = "public";
  if (CONCAT31(in_register_00000009,is_private) != 0) {
    __s = pcVar5;
  }
  local_70 = local_60;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar3);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"extension ",10);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : Hashable",0xb);
  block_open(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," func hash(into hasher: inout Hasher)",0x25);
  block_open(this,out);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (tstruct->is_union_ == false) {
      for (; pptVar6 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        ptVar1 = *pptVar6;
        poVar4 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"hasher.combine(",0xf);
        maybe_escape_identifier(&local_50,this,&ptVar1->name_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"switch self {",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        ptVar1 = *pptVar6;
        poVar4 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case .",6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(ptVar1->name_)._M_dataplus._M_p,(ptVar1->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(let val): hasher.combine(val)",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_hashable_extension(ostream& out,
                                                                 t_struct* tstruct,
                                                                 bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
  indent(out) << "extension " << tstruct->get_name() << " : Hashable";
  block_open(out);
  out << endl;
  indent(out) << visibility << " func hash(into hasher: inout Hasher)";
  block_open(out);

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  if (!members.empty()) {
    if (!tstruct->is_union()) {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        t_field* tfield = *m_iter;
        indent(out) << "hasher.combine(" << maybe_escape_identifier(tfield->get_name()) << ")" << endl;
      }
    } else {
      indent(out) << "switch self {" << endl;
      for (m_iter = members.begin(); m_iter != members.end(); m_iter++) {
        t_field *tfield = *m_iter;
        indent(out) << "case ." << tfield->get_name() << "(let val): hasher.combine(val)" << endl;
      }
      indent(out) << "}" << endl << endl;
    }
  }
  block_close(out);
  out << endl;
  block_close(out);
  out << endl;
}